

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimRecursively
          (Impl *this,int parent,int current,Prim *parentPrim,int level,
          PathIndexToSpecIndexMap *psmap,Stage *stage)

{
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pNVar3;
  pointer pcVar4;
  uint __val;
  Type TVar5;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long lVar10;
  pointer puVar11;
  _Base_ptr p_Var12;
  size_type sVar13;
  mapped_type *pmVar14;
  long *plVar15;
  undefined8 *puVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  PrimMeta *pPVar19;
  mapped_type *pmVar20;
  size_type sVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  uint uVar24;
  size_type *psVar25;
  ulong uVar26;
  long *plVar27;
  undefined1 *puVar28;
  _Base_ptr p_Var29;
  Impl *this_01;
  char cVar30;
  char *pcVar31;
  undefined8 uVar32;
  uint uVar33;
  Prim *parentPrim_00;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *this_02;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  ulong uVar35;
  int current_local;
  Impl *local_a18;
  _Base_ptr local_a10;
  int parent_local;
  _Base_ptr local_a00;
  _Base_ptr local_9f8;
  Prim *local_9f0;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string variantSetName;
  string __str;
  string __str_1;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *local_948;
  string prop_name;
  long local_920 [10];
  ios_base local_8d0 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8 [6];
  ios_base local_758 [976];
  optional<tinyusdz::Prim> prim;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xcd7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"Prim hierarchy is too deep.",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    goto LAB_0018c2ec;
  }
  if ((-1 < current) &&
     (current < (int)((ulong)((long)(this->_nodes).
                                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_nodes).
                                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x41041041))
  {
    prim._0_8_ = prim._0_8_ & 0xffffffffffffff00;
    local_9f0 = parentPrim;
    memset(&prim.contained,0,0x350);
    p_Var12 = (this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_a10 = &(this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = local_a10;
    p_Var29 = local_a10;
    if (p_Var12 != (_Base_ptr)0x0) {
      do {
        if (parent <= (int)p_Var12[1]._M_color) {
          p_Var9 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < parent];
      } while (p_Var12 != (_Base_ptr)0x0);
      p_Var12 = (_Base_ptr)0x0;
      if ((p_Var9 != local_a10) && (p_Var29 = p_Var9, parent < (int)p_Var9[1]._M_color)) {
        p_Var29 = local_a10;
      }
    }
    bVar7 = ReconstructPrimNode(this,parent,current,(int)p_Var12,p_Var29 != local_a10,psmap,stage,
                                &prim);
    if (bVar7) {
      parentPrim_00 = (Prim *)0x0;
      if (prim.has_value_ != false) {
        parentPrim_00 = (Prim *)&prim.contained;
      }
      lVar10 = (long)current_local;
      pNVar3 = (this->_nodes).
               super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = pNVar3[lVar10]._children.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a18 = this;
      if (*(pointer *)
           ((long)&pNVar3[lVar10]._children.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
          puVar11) {
        uVar35 = 0;
        do {
          bVar7 = ReconstructPrimRecursively
                            (local_a18,current_local,(int)puVar11[uVar35],parentPrim_00,level + 1,
                             psmap,stage);
          if (!bVar7) goto LAB_0018d391;
          uVar35 = uVar35 + 1;
          puVar11 = pNVar3[lVar10]._children.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar35 < (ulong)((long)*(pointer *)
                                         ((long)&pNVar3[lVar10]._children.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl + 8) - (long)puVar11 >> 3));
      }
      this_01 = local_a18;
      this_02 = &local_a18->_variantPrims;
      p_Var12 = (local_a18->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      if (p_Var12 == (_Base_ptr)0x0) {
LAB_0018bdae:
        this_01 = local_a18;
        p_Var12 = (local_a18->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        if (p_Var12 != (_Base_ptr)0x0) {
          p_Var1 = &(local_a18->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = &p_Var1->_M_header;
          do {
            if (current_local <= (int)p_Var12[1]._M_color) {
              p_Var9 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < current_local];
          } while (p_Var12 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var9 != p_Var1) && ((int)p_Var9[1]._M_color <= current_local)) {
            if (prim.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd52);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              pcVar31 = "Internal error: must be Prim.";
              lVar10 = 0x1d;
              goto LAB_0018ca34;
            }
            pmVar17 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&local_a18->_variantPrimChildren,&current_local);
            p_Var12 = (_Base_ptr)
                      (pmVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_a00 = (_Base_ptr)
                        (pmVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            if (p_Var12 != local_a00) {
              local_948 = this_02;
              do {
                sVar13 = ::std::
                         map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                         ::count(this_02,(key_type_conflict2 *)p_Var12);
                if (sVar13 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  pcVar31 = "Internal error: variant Prim children not found.";
                  lVar10 = 0x30;
                  goto LAB_0018ca34;
                }
                local_a10 = p_Var12;
                pmVar14 = ::std::
                          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                          ::at(this_02,(key_type_conflict2 *)p_Var12);
                bVar7 = is_variantElementName((string *)&pmVar14->_elementPath);
                if (!bVar7) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd64);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "Corrupted Crate. Variant Prim has invalid element_name.",0x37);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  this_01 = local_a18;
                  goto LAB_0018ca6b;
                }
                lVar10 = 0x10;
                do {
                  puVar28 = (undefined1 *)((long)local_920 + lVar10 + -0x20);
                  *(undefined1 **)((long)&__str_1.field_2 + lVar10 + 8) = puVar28;
                  *(undefined8 *)((long)&local_948 + lVar10) = 0;
                  *puVar28 = 0;
                  lVar10 = lVar10 + 0x20;
                } while (lVar10 != 0x50);
                bVar7 = tokenize_variantElement
                                  ((string *)&pmVar14->_elementPath,
                                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)&prop_name);
                local_9f8 = (_Base_ptr)CONCAT71(local_9f8._1_7_,bVar7);
                if (bVar7) {
                  _ss_e = (pointer)local_7b8;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&ss_e,prop_name._M_dataplus._M_p,
                             prop_name._M_dataplus._M_p + prop_name._M_string_length);
                  toks._M_elems[0]._M_dataplus._M_p = (pointer)&toks._M_elems[0].field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&toks,local_920[0],local_920[1] + local_920[0]);
                  if (prim.has_value_ == false) {
                    __assert_fail("has_value()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                  ,0x550,
                                  "value_type *nonstd::optional_lite::optional<tinyusdz::Prim>::operator->() [T = tinyusdz::Prim]"
                                 );
                  }
                  pmVar18 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                                          *)((long)&prim.contained + 800),(key_type *)&ss_e);
                  if ((pmVar18->name)._M_string_length == 0) {
                    ::std::__cxx11::string::_M_assign((string *)pmVar18);
                  }
                  pPVar19 = Prim::metas(pmVar14);
                  pmVar20 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                            ::operator[](&pmVar18->variantSet,toks._M_elems);
                  PrimMetas::operator=(&pmVar20->_metas,pPVar19);
                  pmVar20 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                            ::operator[](&pmVar18->variantSet,toks._M_elems);
                  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=
                            (&pmVar20->_primChildren,&pmVar14->_children);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  this_02 = local_948;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_ss_e != local_7b8) {
                    operator_delete(_ss_e,local_7b8[0]._M_allocated_capacity + 1);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<((key_type *)&ss_e,0xd69);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"Invalid variant element_name.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_a18,toks._M_elems);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::ios_base::~ios_base(local_758);
                }
                lVar10 = -0x40;
                plVar15 = local_920 + 2;
                do {
                  if (plVar15 != (long *)plVar15[-2]) {
                    operator_delete((long *)plVar15[-2],*plVar15 + 1);
                  }
                  plVar15 = plVar15 + -4;
                  lVar10 = lVar10 + 0x20;
                } while (lVar10 != 0);
                if ((char)local_9f8 == '\0') goto LAB_0018c4e5;
                p_Var12 = (_Base_ptr)&local_a10->field_0x4;
                this_01 = local_a18;
              } while (p_Var12 != local_a00);
            }
          }
        }
        if (parent == 0) {
          bVar7 = true;
          if (prim.has_value_ != true) goto LAB_0018d39b;
        }
        else {
          sVar13 = ::std::
                   map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                   ::count(this_02,&parent_local);
          if (sVar13 != 0) {
            if (prim.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd85);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e,"parent is variantPrim, but current is not Prim.",0x2f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushWarn(this_01,&prop_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              ::std::ios_base::~ios_base(local_758);
            }
            else {
              pmVar14 = ::std::
                        map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                        ::at(this_02,&parent_local);
              if (prim.has_value_ == false) {
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x591,
                              "value_type &nonstd::optional_lite::optional<tinyusdz::Prim>::value() [T = tinyusdz::Prim]"
                             );
              }
              ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
              emplace_back<tinyusdz::Prim>
                        ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                         &pmVar14->_children,(Prim *)&prim.contained);
            }
            bVar7 = true;
            goto LAB_0018d39b;
          }
          bVar7 = true;
          if (local_9f0 == (Prim *)0x0 || prim.has_value_ != true) goto LAB_0018d39b;
          stage = (Stage *)&local_9f0->_children;
        }
        bVar7 = true;
        ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                  ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)stage,
                   (Prim *)&prim.contained);
        goto LAB_0018d39b;
      }
      this_00 = &local_a18->_variantPropChildren;
      p_Var1 = &(local_a18->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var1->_M_header;
      do {
        if (current_local <= (int)p_Var12[1]._M_color) {
          p_Var9 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < current_local];
      } while (p_Var12 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 == p_Var1) || (current_local < (int)p_Var9[1]._M_color))
      goto LAB_0018bdae;
      p_Var12 = (local_a18->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = local_a10;
      if (p_Var12 == (_Base_ptr)0x0) {
LAB_0018c3bc:
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss_e,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd1b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar31 = "Internal error: variant attribute is not a child of VariantPrim.";
        lVar10 = 0x40;
LAB_0018c45d:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar31,lVar10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_01,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) goto LAB_0018c4b4;
      }
      else {
        do {
          if (current_local <= (int)*(size_t *)(p_Var12 + 1)) {
            p_Var9 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < current_local];
        } while (p_Var12 != (_Base_ptr)0x0);
        if ((p_Var9 == local_a10) || (current_local < (int)p_Var9[1]._M_color)) goto LAB_0018c3bc;
        if (local_9f0 == (Prim *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd1f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar31 = "Internal error: parentPrim should exist.";
          lVar10 = 0x28;
          goto LAB_0018c45d;
        }
        pmVar14 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at(this_02,&current_local);
        bVar7 = is_variantElementName((string *)&pmVar14->_elementPath);
        if (bVar7) {
          lVar10 = 0x10;
          do {
            puVar28 = (undefined1 *)((long)&toks._M_elems[0]._M_dataplus._M_p + lVar10);
            *(undefined1 **)((long)&local_9f8 + lVar10) = puVar28;
            *(undefined8 *)((long)toks._M_elems + lVar10 + -8) = 0;
            *puVar28 = 0;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x50);
          bVar7 = tokenize_variantElement((string *)&pmVar14->_elementPath,&toks);
          if (!bVar7) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd2e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,"Invalid variant element_name.",0x1d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this_01,&prop_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
              operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            ::std::ios_base::~ios_base(local_758);
            lVar10 = -0x40;
            paVar34 = &toks._M_elems[1].field_2;
            do {
              plVar15 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(paVar34 + -1))->_M_dataplus)._M_p;
              if (paVar34 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar15) {
                operator_delete(plVar15,paVar34->_M_allocated_capacity + 1);
              }
              paVar34 = paVar34 + -2;
              lVar10 = lVar10 + 0x20;
            } while (lVar10 != 0);
            goto LAB_0018c4e5;
          }
          variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&variantSetName,toks._M_elems[0]._M_dataplus._M_p,
                     toks._M_elems[0]._M_dataplus._M_p + toks._M_elems[0]._M_string_length);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&__str,toks._M_elems[1]._M_dataplus._M_p,
                     toks._M_elems[1]._M_dataplus._M_p + toks._M_elems[1]._M_string_length);
          Variant::Variant((Variant *)&ss_e);
          pmVar17 = ::std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::at(this_00,&current_local);
          p_Var12 = (_Base_ptr)
                    (pmVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_9f8 = (_Base_ptr)
                      (pmVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          if (p_Var12 != local_9f8) {
            local_a00 = (_Base_ptr)&this_01->_variantProps;
            do {
              p_Var9 = local_a00;
              sVar21 = ::std::
                       map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                       ::count((map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                                *)local_a00,(key_type_conflict2 *)p_Var12);
              if (sVar21 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"ReconstructPrimRecursively",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(&prop_name,0xd39);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"Internal error: variant Property not found.",0x2b)
                ;
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushError(this_01,&__str_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                  operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1
                                 );
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
                ::std::ios_base::~ios_base(local_8d0);
                bVar7 = false;
                goto LAB_0018d302;
              }
              local_a10 = p_Var12;
              pmVar22 = ::std::
                        map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                        ::at((map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                              *)p_Var9,(key_type_conflict2 *)p_Var12);
              prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
              pcVar4 = (pmVar22->first)._prop_part._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&prop_name,pcVar4,
                         pcVar4 + (pmVar22->first)._prop_part._M_string_length);
              pmVar23 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      *)&ss_e,&prop_name);
              ::std::__cxx11::string::_M_assign((string *)pmVar23);
              (pmVar23->_attrib)._varying_authored = (pmVar22->second)._attrib._varying_authored;
              (pmVar23->_attrib)._variability = (pmVar22->second)._attrib._variability;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar23->_attrib)._type_name);
              linb::any::operator=
                        ((any *)&(pmVar23->_attrib)._var,(any *)&(pmVar22->second)._attrib._var);
              (pmVar23->_attrib)._var._blocked = (pmVar22->second)._attrib._var._blocked;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar23->_attrib)._var._ts,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar22->second)._attrib._var._ts);
              (pmVar23->_attrib)._var._ts._dirty = (pmVar22->second)._attrib._var._ts._dirty;
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar23->_attrib)._paths,&(pmVar22->second)._attrib._paths);
              AttrMetas::operator=(&(pmVar23->_attrib)._metas,&(pmVar22->second)._attrib._metas);
              TVar5 = (pmVar22->second)._type;
              pmVar23->_listOpQual = (pmVar22->second)._listOpQual;
              pmVar23->_type = TVar5;
              (pmVar23->_rel).type = (pmVar22->second)._rel.type;
              Path::operator=(&(pmVar23->_rel).targetPath,&(pmVar22->second)._rel.targetPath);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar23->_rel).targetPathVector,&(pmVar22->second)._rel.targetPathVector)
              ;
              (pmVar23->_rel).listOpQual = (pmVar22->second)._rel.listOpQual;
              AttrMetas::operator=(&(pmVar23->_rel)._metas,&(pmVar22->second)._rel._metas);
              (pmVar23->_rel)._varying_authored = (pmVar22->second)._rel._varying_authored;
              ::std::__cxx11::string::_M_assign((string *)&pmVar23->_prop_value_type_name);
              pmVar23->_has_custom = (pmVar22->second)._has_custom;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              p_Var12 = (_Base_ptr)&local_a10->field_0x4;
            } while (p_Var12 != local_9f8);
          }
          pmVar18 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                                  *)&local_9f0->_variantSets,&variantSetName);
          if ((pmVar18->name)._M_string_length == 0) {
            ::std::__cxx11::string::_M_assign((string *)pmVar18);
          }
          pmVar20 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                    ::operator[](&pmVar18->variantSet,&__str);
          Variant::operator=(pmVar20,(Variant *)&ss_e);
          bVar7 = true;
LAB_0018d302:
          Variant::~Variant((Variant *)&ss_e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
            operator_delete(variantSetName._M_dataplus._M_p,
                            variantSetName.field_2._M_allocated_capacity + 1);
          }
          lVar10 = -0x40;
          paVar34 = &toks._M_elems[1].field_2;
          do {
            plVar15 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(paVar34 + -1))->_M_dataplus)._M_p;
            if (paVar34 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15) {
              operator_delete(plVar15,paVar34->_M_allocated_capacity + 1);
            }
            paVar34 = paVar34 + -2;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0);
          if (!bVar7) {
LAB_0018d391:
            bVar7 = false;
            goto LAB_0018d39b;
          }
          goto LAB_0018bdae;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss_e,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xd29);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar31 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
        lVar10 = 0x42;
LAB_0018ca34:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar31,lVar10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
        ::std::__cxx11::stringbuf::str();
LAB_0018ca6b:
        PushError(this_01,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
LAB_0018c4b4:
          operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      ::std::ios_base::~ios_base(local_758);
    }
LAB_0018c4e5:
    bVar7 = false;
LAB_0018d39b:
    if (prim.has_value_ != true) {
      return bVar7;
    }
    Prim::~Prim((Prim *)&prim.contained);
    return bVar7;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ss_e,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
             ,0x55);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ss_e,"ReconstructPrimRecursively",0x1a);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0xce0);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  __val = -current_local;
  if (0 < current_local) {
    __val = current_local;
  }
  __len = 1;
  if (9 < __val) {
    uVar35 = (ulong)__val;
    uVar33 = 4;
    do {
      __len = uVar33;
      uVar24 = (uint)uVar35;
      if (uVar24 < 100) {
        __len = __len - 2;
        goto LAB_0018bf52;
      }
      if (uVar24 < 1000) {
        __len = __len - 1;
        goto LAB_0018bf52;
      }
      if (uVar24 < 10000) goto LAB_0018bf52;
      uVar35 = uVar35 / 10000;
      uVar33 = __len + 4;
    } while (99999 < uVar24);
    __len = __len + 1;
  }
LAB_0018bf52:
  uVar33 = (uint)current_local >> 0x1f;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)(current_local >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar33,__len,__val);
  plVar15 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x39c41e);
  psVar25 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar25) {
    variantSetName.field_2._M_allocated_capacity = *psVar25;
    variantSetName.field_2._8_8_ = plVar15[3];
    variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
  }
  else {
    variantSetName.field_2._M_allocated_capacity = *psVar25;
    variantSetName._M_dataplus._M_p = (pointer)*plVar15;
  }
  variantSetName._M_string_length = plVar15[1];
  *plVar15 = (long)psVar25;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)::std::__cxx11::string::append((char *)&variantSetName);
  paVar34 = &toks._M_elems[0].field_2;
  psVar25 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar25) {
    toks._M_elems[0].field_2._M_allocated_capacity = *psVar25;
    toks._M_elems[0].field_2._8_8_ = plVar15[3];
    toks._M_elems[0]._M_dataplus._M_p = (pointer)paVar34;
  }
  else {
    toks._M_elems[0].field_2._M_allocated_capacity = *psVar25;
    toks._M_elems[0]._M_dataplus._M_p = (pointer)*plVar15;
  }
  toks._M_elems[0]._M_string_length = plVar15[1];
  *plVar15 = (long)psVar25;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  uVar35 = ((long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
  cVar30 = '\x01';
  if (9 < uVar35) {
    uVar26 = uVar35;
    cVar6 = '\x04';
    do {
      cVar30 = cVar6;
      if (uVar26 < 100) {
        cVar30 = cVar30 + -2;
        goto LAB_0018c0c9;
      }
      if (uVar26 < 1000) {
        cVar30 = cVar30 + -1;
        goto LAB_0018c0c9;
      }
      if (uVar26 < 10000) goto LAB_0018c0c9;
      bVar7 = 99999 < uVar26;
      uVar26 = uVar26 / 10000;
      cVar6 = cVar30 + '\x04';
    } while (bVar7);
    cVar30 = cVar30 + '\x01';
  }
LAB_0018c0c9:
  paVar2 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar30);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar35);
  uVar35 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
           toks._M_elems[0]._M_string_length;
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toks._M_elems[0]._M_dataplus._M_p != paVar34) {
    uVar32 = toks._M_elems[0].field_2._M_allocated_capacity;
  }
  if ((ulong)uVar32 < uVar35) {
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      uVar32 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < uVar35) goto LAB_0018c13e;
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&__str_1,0,(char *)0x0,(ulong)toks._M_elems[0]._M_dataplus._M_p);
  }
  else {
LAB_0018c13e:
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::_M_append((char *)&toks,(ulong)__str_1._M_dataplus._M_p);
  }
  prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
  psVar25 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar25) {
    prop_name.field_2._M_allocated_capacity = *psVar25;
    prop_name.field_2._8_8_ = puVar16[3];
  }
  else {
    prop_name.field_2._M_allocated_capacity = *psVar25;
    prop_name._M_dataplus._M_p = (pointer)*puVar16;
  }
  prop_name._M_string_length = puVar16[1];
  *puVar16 = psVar25;
  puVar16[1] = 0;
  *(char *)psVar25 = '\0';
  plVar15 = (long *)::std::__cxx11::string::append((char *)&prop_name);
  pcVar31 = (char *)((long)&prim.contained.data + 8);
  plVar27 = plVar15 + 2;
  if ((long *)*plVar15 == plVar27) {
    prim.contained._8_8_ = *plVar27;
    prim.contained._16_8_ = plVar15[3];
    prim._0_8_ = pcVar31;
  }
  else {
    prim.contained._8_8_ = *plVar27;
    prim._0_8_ = (long *)*plVar15;
  }
  prim.contained.data.__align = *(anon_struct_8_0_00000001_for___align *)(plVar15 + 1);
  *plVar15 = (long)plVar27;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&ss_e,(char *)prim._0_8_,(long)prim.contained.data._0_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((char *)prim._0_8_ != pcVar31) {
    operator_delete((void *)prim._0_8_,prim.contained._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
    operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toks._M_elems[0]._M_dataplus._M_p != paVar34) {
    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
    operator_delete(variantSetName._M_dataplus._M_p,variantSetName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
LAB_0018c2ec:
  ::std::__cxx11::stringbuf::str();
  PushError(this,(string *)&prim);
  if ((undefined1 *)prim._0_8_ != (undefined1 *)((long)&prim.contained + 8)) {
    operator_delete((void *)prim._0_8_,prim.contained._8_8_ + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base(local_758);
  return false;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimRecursively(
    int parent, int current, Prim *parentPrim, int level,
    const PathIndexToSpecIndexMap &psmap, Stage *stage) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Prim hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  //
  // TODO: Use bottom-up reconstruction(traverse child first)
  //

  // null : parent node is Property or other Spec type.
  // non-null : parent node is Prim
  Prim *currPrimPtr = nullptr;
  nonstd::optional<Prim> prim;

  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimNode(parent, current, level, is_parent_variant, psmap,
                           stage, &prim)) {
    return false;
  }

  if (prim) {
    currPrimPtr = &(prim.value());
  }

  // Traverse children
  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimRecursively(current, int(node.GetChildren()[i]),
                                      currPrimPtr, level + 1, psmap, stage)) {
        return false;
      }
      DCOUT("DONE Reconstuct Prim children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrim) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrim should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    Variant variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.properties()[prop_name] = std::get<1>(pp);
    }

    VariantSet &vs = parentPrim->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!prim) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant Prim ", prim->element_name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrims.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const Prim &vp = _variantPrims.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.element_name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.element_name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.element_name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSet &vs = prim->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].primChildren() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (prim) {
      stage->root_prims().emplace_back(std::move(prim.value()));
    }
  } else {
    if (_variantPrims.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!prim) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        Prim &vp = _variantPrims.at(parent);
        vp.children().emplace_back(std::move(prim.value()));
      }
    } else if (prim && parentPrim) {
      // Add to parent prim.
      parentPrim->children().emplace_back(std::move(prim.value()));
    }
  }

  return true;
}